

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyEllipsoid::ChBodyEasyEllipsoid
          (ChBodyEasyEllipsoid *this,void **vtt,ChVector<double> *radius,double density,
          bool visualize,bool collide,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::collision::ChCollisionModel> *collision_model)

{
  _func_int **pp_Var1;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_58;
  ChVector<double> local_48;
  
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &collision_model->
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  ChBody::ChBody(&this->super_ChBody,vtt + 1,
                 (shared_ptr<chrono::collision::ChCollisionModel> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var1;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0x1152380;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0x1152418;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 6);
  *(void **)(pp_Var1[-3] + -0x78 +
            (long)(&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.coord + -1) + 0x30) = vtt[7];
  local_48.m_data[0] = radius->m_data[0];
  local_48.m_data[1] = radius->m_data[1];
  local_48.m_data[2] = radius->m_data[2];
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  SetupBody(this,&local_48,density,visualize,collide,
            (shared_ptr<chrono::ChMaterialSurface> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return;
}

Assistant:

ChBodyEasyEllipsoid::ChBodyEasyEllipsoid(ChVector<> radius,
                                         double density,
                                         bool visualize,
                                         bool collide,
                                         std::shared_ptr<ChMaterialSurface> material,
                                         std::shared_ptr<collision::ChCollisionModel> collision_model)
    : ChBody(collision_model) {
    SetupBody(radius, density, visualize, collide, material);
}